

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(ArgBinder *this)

{
  Arg *this_00;
  int iVar1;
  CommandLine<Catch::ConfigData> *pCVar2;
  pointer pcVar3;
  IArgFunction<Catch::ConfigData> *pIVar4;
  auto_ptr_ref<Clara::CommandLine<Catch::ConfigData>::Arg> __ref;
  logic_error *this_01;
  element_type *__tmp;
  pair<int,_Clara::CommandLine<Catch::ConfigData>::Arg> local_a8;
  
  if (this->m_cl != (CommandLine<Catch::ConfigData> *)0x0) {
    this_00 = &this->m_arg;
    Arg::validate(this_00);
    iVar1 = (this->m_arg).position;
    if (iVar1 == -1) {
      if (((this->m_arg).shortNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (this->m_arg).shortNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((this->m_arg).longName._M_string_length == 0)) {
        if ((this->m_cl->m_arg)._M_ptr != (Arg *)0x0) {
          this_01 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_01,"Only one unpositional argument can be added");
          __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        __ref._M_ptr = (Arg *)operator_new(0x88);
        Arg::Arg(__ref._M_ptr,this_00);
        local_a8.first = 0;
        local_a8._4_4_ = 0;
        std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::operator=
                  (&this->m_cl->m_arg,__ref);
        std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::~auto_ptr
                  ((auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg> *)&local_a8);
      }
      else {
        std::
        vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
        ::push_back(&this->m_cl->m_options,this_00);
      }
    }
    else {
      pCVar2 = this->m_cl;
      local_a8.first = iVar1;
      Arg::Arg(&local_a8.second,this_00);
      std::
      _Rb_tree<int,std::pair<int_const,Clara::CommandLine<Catch::ConfigData>::Arg>,std::_Select1st<std::pair<int_const,Clara::CommandLine<Catch::ConfigData>::Arg>>,std::less<int>,std::allocator<std::pair<int_const,Clara::CommandLine<Catch::ConfigData>::Arg>>>
      ::_M_emplace_unique<std::pair<int,Clara::CommandLine<Catch::ConfigData>::Arg>>
                ((_Rb_tree<int,std::pair<int_const,Clara::CommandLine<Catch::ConfigData>::Arg>,std::_Select1st<std::pair<int_const,Clara::CommandLine<Catch::ConfigData>::Arg>>,std::less<int>,std::allocator<std::pair<int_const,Clara::CommandLine<Catch::ConfigData>::Arg>>>
                  *)&pCVar2->m_positionalArgs,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.second.argName._M_dataplus._M_p != &local_a8.second.argName.field_2) {
        operator_delete(local_a8.second.argName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.second.description._M_dataplus._M_p != &local_a8.second.description.field_2) {
        operator_delete(local_a8.second.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.second.longName._M_dataplus._M_p != &local_a8.second.longName.field_2) {
        operator_delete(local_a8.second.longName._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8.second.shortNames);
      if (local_a8.second.boundField.functionObj != (IArgFunction<Catch::ConfigData> *)0x0) {
        (*(local_a8.second.boundField.functionObj)->_vptr_IArgFunction[1])();
      }
      iVar1 = (this->m_arg).position;
      if (this->m_cl->m_highestSpecifiedArgPosition < iVar1) {
        this->m_cl->m_highestSpecifiedArgPosition = iVar1;
      }
    }
  }
  pcVar3 = (this->m_arg).argName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->m_arg).argName.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->m_arg).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->m_arg).description.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->m_arg).longName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->m_arg).longName.field_2) {
    operator_delete(pcVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->m_arg).shortNames);
  pIVar4 = (this->m_arg).boundField.functionObj;
  if (pIVar4 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar4->_vptr_IArgFunction[1])();
  }
  return;
}

Assistant:

~ArgBinder() {
                if( m_cl ) {
                    m_arg.validate();
                    if( m_arg.isFixedPositional() ) {
                        m_cl->m_positionalArgs.insert( std::make_pair( m_arg.position, m_arg ) );
                        if( m_arg.position > m_cl->m_highestSpecifiedArgPosition )
                            m_cl->m_highestSpecifiedArgPosition = m_arg.position;
                    }
                    else if( m_arg.isAnyPositional() ) {
                        if( m_cl->m_arg.get() )
                            throw std::logic_error( "Only one unpositional argument can be added" );
                        m_cl->m_arg = std::auto_ptr<Arg>( new Arg( m_arg ) );
                    }
                    else
                        m_cl->m_options.push_back( m_arg );
                }
            }